

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall
Assimp::IFC::Schema_2x3::IfcCompositeProfileDef::~IfcCompositeProfileDef
          (IfcCompositeProfileDef *this)

{
  _func_int *p_Var1;
  long *plVar2;
  _func_int *p_Var3;
  void *pvVar4;
  
  p_Var3 = (this->super_IfcProfileDef).
           super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProfileDef,_2UL>._vptr_ObjectHelper[-3];
  p_Var1 = (_func_int *)
           ((long)&(this->super_IfcProfileDef).
                   super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProfileDef,_2UL>.
                   _vptr_ObjectHelper + (long)p_Var3);
  plVar2 = (long *)((this->Label).ptr.field_2._M_local_buf + (long)p_Var3);
  plVar2[-0x12] = (long)&PTR__IfcCompositeProfileDef_00817ba8;
  plVar2[3] = (long)&PTR__IfcCompositeProfileDef_00817bf8;
  plVar2[-7] = (long)&PTR__IfcCompositeProfileDef_00817bd0;
  if ((long *)plVar2[-2] != plVar2) {
    operator_delete((long *)plVar2[-2],*plVar2 + 1);
  }
  pvVar4 = *(void **)(p_Var1 + 0x68);
  if (pvVar4 != (void *)0x0) {
    operator_delete(pvVar4,*(long *)(p_Var1 + 0x78) - (long)pvVar4);
  }
  *(undefined8 *)p_Var1 = 0x817c20;
  *(undefined8 *)(p_Var1 + 0xa8) = 0x817c48;
  if (*(code **)(p_Var1 + 0x30) != p_Var1 + 0x40) {
    operator_delete(*(code **)(p_Var1 + 0x30),*(long *)(p_Var1 + 0x40) + 1);
  }
  if (*(code **)(p_Var1 + 0x10) != p_Var1 + 0x20) {
    operator_delete(*(code **)(p_Var1 + 0x10),*(long *)(p_Var1 + 0x20) + 1);
  }
  operator_delete(p_Var1,0xc0);
  return;
}

Assistant:

IfcCompositeProfileDef() : Object("IfcCompositeProfileDef") {}